

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

void mtree_indent(mtree_writer *mtree)

{
  int iVar1;
  char *__s;
  archive_string *n;
  size_t sVar2;
  long in_RDI;
  char *x;
  char *s;
  char *r;
  int pd;
  int nd;
  int fn;
  int i;
  void *in_stack_ffffffffffffffc8;
  archive_string *as;
  char *local_28;
  size_t n_00;
  int iVar3;
  int iVar4;
  uint in_stack_fffffffffffffff4;
  int iVar5;
  
  if (*(int *)(in_RDI + 0xd8) == 0) {
    iVar1 = 0;
    iVar3 = 0;
  }
  else if (*(int *)(in_RDI + 0xf8) == 0) {
    iVar3 = 0;
    if (*(int *)(in_RDI + 0xdc) != 0) {
      iVar3 = 4;
    }
    iVar1 = 0;
  }
  else {
    iVar3 = 0;
    iVar1 = *(int *)(in_RDI + 0xdc) << 2;
  }
  iVar4 = 1;
  local_28 = *(char **)(in_RDI + 0x40);
  for (__s = local_28; as = (archive_string *)0x0, *__s == ' '; __s = __s + 1) {
  }
  while (n = (archive_string *)strchr(__s,0x20), n != (archive_string *)0x0) {
    if (iVar4 == 0) {
      if ((long)((long)n + ((long)iVar1 - (long)local_28)) < 0x3f) {
        as = n;
        __s = (char *)((long)&n->s + 1);
      }
      else {
        if (as == (archive_string *)0x0) {
          as = n;
        }
        archive_strncat((archive_string *)((ulong)in_stack_fffffffffffffff4 << 0x20),
                        (void *)CONCAT44(iVar3,iVar1),(size_t)n);
        archive_strncat((archive_string *)CONCAT44(in_stack_fffffffffffffff4,iVar4),
                        (void *)CONCAT44(iVar3,iVar1),(size_t)n);
        for (in_stack_fffffffffffffff4 = 0; (int)in_stack_fffffffffffffff4 < iVar1 + 0x10;
            in_stack_fffffffffffffff4 = in_stack_fffffffffffffff4 + 1) {
          archive_strappend_char(as,(char)((ulong)in_stack_ffffffffffffffc8 >> 0x38));
        }
        local_28 = (char *)((long)&as->s + 1);
        as = (archive_string *)0x0;
        __s = local_28;
      }
    }
    else {
      iVar4 = 0;
      for (iVar5 = 0; iVar5 < iVar3 + iVar1; iVar5 = iVar5 + 1) {
        archive_strappend_char(as,(char)((ulong)in_stack_ffffffffffffffc8 >> 0x38));
      }
      archive_strncat((archive_string *)CONCAT44(iVar5,iVar4),(void *)CONCAT44(iVar3,iVar1),
                      (size_t)n);
      if ((long)((long)n + ((long)iVar3 - (long)local_28)) < 0x10) {
        for (in_stack_fffffffffffffff4 = ((int)n - (int)local_28) + iVar3;
            (int)in_stack_fffffffffffffff4 < 0x10;
            in_stack_fffffffffffffff4 = in_stack_fffffffffffffff4 + 1) {
          archive_strappend_char(as,(char)((ulong)in_stack_ffffffffffffffc8 >> 0x38));
        }
      }
      else {
        archive_strncat((archive_string *)CONCAT44(iVar5,iVar4),(void *)CONCAT44(iVar3,iVar1),
                        (size_t)n);
        for (in_stack_fffffffffffffff4 = 0; (int)in_stack_fffffffffffffff4 < iVar1 + 0x10;
            in_stack_fffffffffffffff4 = in_stack_fffffffffffffff4 + 1) {
          archive_strappend_char(as,(char)((ulong)in_stack_ffffffffffffffc8 >> 0x38));
        }
      }
      local_28 = (char *)((long)&n->s + 1);
      as = (archive_string *)0x0;
      __s = local_28;
    }
  }
  n_00 = 0;
  if (iVar4 != 0) {
    for (in_stack_fffffffffffffff4 = 0; (int)in_stack_fffffffffffffff4 < iVar3 + iVar1;
        in_stack_fffffffffffffff4 = in_stack_fffffffffffffff4 + 1) {
      archive_strappend_char(as,(char)((ulong)in_stack_ffffffffffffffc8 >> 0x38));
    }
    archive_strcat(as,in_stack_ffffffffffffffc8);
    sVar2 = strlen(local_28);
    local_28 = local_28 + sVar2;
  }
  if (as != (archive_string *)0x0) {
    in_stack_ffffffffffffffc8 = (void *)(long)iVar1;
    sVar2 = strlen(local_28);
    if (0x3e < (long)in_stack_ffffffffffffffc8 + sVar2) {
      archive_strncat((archive_string *)CONCAT44(in_stack_fffffffffffffff4,iVar4),
                      (void *)CONCAT44(iVar3,iVar1),n_00);
      archive_strncat((archive_string *)CONCAT44(in_stack_fffffffffffffff4,iVar4),
                      (void *)CONCAT44(iVar3,iVar1),n_00);
      for (iVar3 = 0; iVar3 < iVar1 + 0x10; iVar3 = iVar3 + 1) {
        archive_strappend_char(as,(char)((ulong)in_stack_ffffffffffffffc8 >> 0x38));
      }
      as = (archive_string *)((long)&as->s + 1);
    }
  }
  archive_strcat(as,in_stack_ffffffffffffffc8);
  *(undefined8 *)(in_RDI + 0x48) = 0;
  return;
}

Assistant:

static void
mtree_indent(struct mtree_writer *mtree)
{
	int i, fn, nd, pd;
	const char *r, *s, *x;

	if (mtree->classic) {
		if (mtree->indent) {
			nd = 0;
			pd = mtree->depth * 4;
		} else {
			nd = mtree->depth?4:0;
			pd = 0;
		}
	} else
		nd = pd = 0;
	fn = 1;
	s = r = mtree->ebuf.s;
	x = NULL;
	while (*r == ' ')
		r++;
	while ((r = strchr(r, ' ')) != NULL) {
		if (fn) {
			fn = 0;
			for (i = 0; i < nd + pd; i++)
				archive_strappend_char(&mtree->buf, ' ');
			archive_strncat(&mtree->buf, s, r - s);
			if (nd + (r -s) > INDENTNAMELEN) {
				archive_strncat(&mtree->buf, " \\\n", 3);
				for (i = 0; i < (INDENTNAMELEN + 1 + pd); i++)
					archive_strappend_char(&mtree->buf, ' ');
			} else {
				for (i = (int)(r -s + nd);
				    i < (INDENTNAMELEN + 1); i++)
					archive_strappend_char(&mtree->buf, ' ');
			}
			s = ++r;
			x = NULL;
			continue;
		}
		if (pd + (r - s) <= MAXLINELEN - 3 - INDENTNAMELEN)
			x = r++;
		else {
			if (x == NULL)
				x = r;
			archive_strncat(&mtree->buf, s, x - s);
			archive_strncat(&mtree->buf, " \\\n", 3);
			for (i = 0; i < (INDENTNAMELEN + 1 + pd); i++)
				archive_strappend_char(&mtree->buf, ' ');
			s = r = ++x;
			x = NULL;
		}
	}
	if (fn) {
		for (i = 0; i < nd + pd; i++)
			archive_strappend_char(&mtree->buf, ' ');
		archive_strcat(&mtree->buf, s);
		s += strlen(s);
	}
	if (x != NULL && pd + strlen(s) > MAXLINELEN - 3 - INDENTNAMELEN) {
		/* Last keyword is longer. */
		archive_strncat(&mtree->buf, s, x - s);
		archive_strncat(&mtree->buf, " \\\n", 3);
		for (i = 0; i < (INDENTNAMELEN + 1 + pd); i++)
			archive_strappend_char(&mtree->buf, ' ');
		s = ++x;
	}
	archive_strcat(&mtree->buf, s);
	archive_string_empty(&mtree->ebuf);
}